

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.h
# Opt level: O0

uchar * __thiscall
CVmObjByteArray::get_ele_ptr(CVmObjByteArray *this,unsigned_long idx,size_t *bytes_avail)

{
  CVmObjByteArray *this_00;
  uchar **ppuVar1;
  long *in_RDX;
  long in_RSI;
  size_t s3;
  size_t s2;
  size_t s1;
  size_t in_stack_ffffffffffffffc8;
  
  this_00 = (CVmObjByteArray *)(in_RSI - 1U & 0x7fff);
  *in_RDX = 0x8000 - (long)this_00;
  ppuVar1 = get_page_table_ptr(this_00,in_stack_ffffffffffffffc8);
  return ppuVar1[(in_RSI - 1U & 0xfffffff) >> 0xf] + (long)this_00;
}

Assistant:

unsigned char *get_ele_ptr(unsigned long idx, size_t *bytes_avail) const
    {
        size_t s1;
        size_t s2;
        size_t s3;

        /* convert to a zero-based index */
        --idx;
        
        /* 
         *   calculate the page table index - since each page holds 32k
         *   bytes and each page table points to 8k pages, divide by 32k*8k
         *   == 2^15*2^13 == 2^28 
         */
        s1 = idx >> 28;

        /* 
         *   calculate the page index within the page table - each page
         *   holds 32k, so calculate the excess from the page table selector
         *   (i.e, idx % 32k*8k) and then divide by 32k == 2^15 
         */
        s2 = (idx & 0x0FFFFFFF) >> 15;

        /* 
         *   calculate the page offset - this is simply the excess from the
         *   page index 
         */
        s3 = idx & 0x7FFF;

        /*
         *   Each page holds 32k, so the number of contiguous bytes starting
         *   at this byte is 32k less the index.  
         */
        *bytes_avail = (32*1024) - s3;

        /* 
         *   dereference the extension to get the page table, deference the
         *   page table to get the page, and index the page by the offset 
         */
        return get_page_table_ptr(s1)[s2] + s3;
    }